

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_serialization_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  uint uVar2;
  result_type rVar3;
  allocator_type *__a;
  pointer *__nbytes;
  void *__buf;
  void *__buf_00;
  ulong uVar4;
  param_type begin;
  param_type end;
  initializer_list<unsigned_char> __l;
  undefined1 local_2aa0 [8];
  mt19937 rgen;
  random_device rdev;
  ifstream binData;
  int aiStack_370 [122];
  undefined1 local_188 [8];
  ApplicationXimuReader reader;
  ApplicationXimuReader oneQuaternionReader;
  string file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedQuaternion;
  uniform_int_distribution<int> dist;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  value_type_conflict local_31 [8];
  uchar chr;
  
  ApplicationXimuReader::ApplicationXimuReader((ApplicationXimuReader *)&reader._digitalIOCount);
  rgen._M_p = 0xa00300f106e1f05;
  rdev.field_0._M_mt._M_x[0]._0_4_ = 0x80485202;
  __a = (allocator_type *)local_2aa0;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&rgen._M_p;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&file.field_2 + 8),__l,
             __a);
  ximu::ReaderBase::
  fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ReaderBase *)&reader._digitalIOCount,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )file.field_2._8_8_,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  ximu::ReaderBase::read
            ((ReaderBase *)&reader._digitalIOCount,(int)file.field_2._8_8_,__buf,(size_t)__a);
  if (oneQuaternionReader.super_ReaderBase._maxBufferSize == 1) {
    ApplicationXimuReader::ApplicationXimuReader((ApplicationXimuReader *)local_188);
    std::__cxx11::string::string
              ((string *)&oneQuaternionReader._digitalIOCount,"ximu.dmp",(allocator *)&rgen._M_p);
    dist._M_param._M_a = 0;
    dist._M_param._M_b = 0;
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::ifstream::ifstream
              ((void *)((long)&rdev.field_0 + 0x1380),(char *)oneQuaternionReader._digitalIOCount,
               _S_in|_S_bin);
    local_31[0] = std::istream::get();
    while (*(int *)((long)aiStack_370 + *(long *)(rdev.field_0._M_mt._M_p - 0x18)) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dist,local_31);
      local_31[0] = std::istream::get();
    }
    uVar4 = -(long)dist._M_param;
    std::random_device::random_device((random_device *)&rgen._M_p);
    uVar2 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)local_2aa0,(ulong)uVar2);
    __nbytes = &encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x6400000002;
    begin = dist._M_param;
    while (uVar4 != 0) {
      rVar3 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)
                         &encodedQuaternion.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_2aa0);
      uVar4 = uVar4 - (long)rVar3;
      uVar1 = -(long)dist._M_param;
      end = (param_type)((long)rVar3 + (long)begin);
      if (uVar1 <= uVar4) {
        end = (param_type)
              bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
      }
      ximu::ReaderBase::
      fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((ReaderBase *)local_188,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )begin,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )end);
      if (uVar1 <= uVar4) {
        uVar4 = 0;
      }
      ximu::ReaderBase::read((ReaderBase *)local_188,begin._M_a,__buf_00,(size_t)__nbytes);
      begin = end;
    }
    uVar2 = (uint)(reader._quatCount != 0x8d4 || reader.super_ReaderBase._maxBufferSize != 0x235);
    std::random_device::~random_device((random_device *)&rgen._M_p);
    std::ifstream::~ifstream((void *)((long)&rdev.field_0 + 0x1380));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dist);
    std::__cxx11::string::~string((string *)&oneQuaternionReader._digitalIOCount);
    ximu::ReaderBase::~ReaderBase((ReaderBase *)local_188);
  }
  else {
    uVar2 = 1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&file.field_2 + 8));
  ximu::ReaderBase::~ReaderBase((ReaderBase *)&reader._digitalIOCount);
  return uVar2;
}

Assistant:

int main(int argc, char* argv[]) {

  /*
   * Testing one encoded quaternion
   */
  ApplicationXimuReader oneQuaternionReader;
  std::vector<unsigned char> encodedQuaternion = {5, 31, 110, 16, 15, 48, 0, 10, 2, 82, 72, 128 };
  oneQuaternionReader.fill(encodedQuaternion.begin(),encodedQuaternion.end());
  oneQuaternionReader.read();
  if (oneQuaternionReader.QuaternionCount() != 1)
      return 1;



  ApplicationXimuReader reader;

  std::string file("ximu.dmp");
  std::vector<unsigned char> bytes;

  // read the dump
  std::ifstream binData(file.c_str(), std::ios_base::in | std::ios::binary);
  unsigned char chr = binData.get();

  while (binData.good()) {
    bytes.push_back(chr);
    chr = binData.get();
  }
  size_t numBytes = bytes.size();

  // simulate a port
  std::random_device rdev;
  std::mt19937 rgen(rdev());

  // we are simulating recieving between 2 and a 100 bytes
  std::uniform_int_distribution<int> dist(2, 100);

  auto head = bytes.begin();
  auto tail = bytes.begin();
  while (numBytes > 0) {
    int steps = dist(rgen);
    if (numBytes - steps < bytes.size()) {
      head = tail;
      std::advance(tail, steps);
       numBytes -= steps;
    } else {
      head = tail;
      tail = bytes.end();
      numBytes = 0;
    }
    reader.fill(head, tail);
    reader.read();
  }

  // test the number of packets found
  // packet count has been confirmed with the c# verion.

  if (reader.QuaternionCount() != 565)
    return 1;

  if (reader.CalInertialAndMagneticDataCount() != 2260)
    return 1;
  return 0;
}